

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

FloatTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetFloatTextureOrNull
          (TextureParameterDictionary *this,string *name,Allocator alloc)

{
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  _func_int **__n;
  int iVar4;
  uintptr_t iptr;
  const_iterator cVar5;
  ReturnType *pRVar6;
  long *in_RCX;
  ParameterDictionary *pPVar7;
  char *fmt;
  pointer pcVar8;
  long lVar9;
  ReturnType RVar10;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar8 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar8 = *(pointer *)(pcVar1 + 8);
  }
  if (lVar2 != 0) {
    lVar9 = 0;
    do {
      pcVar3 = *(char **)(pcVar8 + lVar9);
      __n = *(_func_int ***)(pcVar3 + 0x28);
      if ((__n == alloc.memoryResource[1]._vptr_memory_resource) &&
         ((__n == (_func_int **)0x0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar3 + 0x20))->_M_dataplus)._M_p,
                        (alloc.memoryResource)->_vptr_memory_resource,(size_t)__n), iVar4 == 0)))) {
        iVar4 = std::__cxx11::string::compare(pcVar3);
        if (iVar4 == 0) {
          if (*(long *)(pcVar3 + 0x90) != 1) {
            if (*(long *)(pcVar3 + 0x90) == 0) {
              fmt = "No texture name provided for parameter \"%s\".";
            }
            else {
              fmt = "More than one texture name provided for parameter \"%s\".";
            }
            ErrorExit<std::__cxx11::string_const&>
                      ((FileLoc *)(pcVar3 + 0x40),fmt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       alloc.memoryResource);
          }
          pcVar3[0xb8] = '\x01';
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
                          *)name->_M_string_length,*(key_type **)(pcVar3 + 0x80));
          if (cVar5._M_node == (_Base_ptr)(name->_M_string_length + 8)) {
            ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((FileLoc *)(pcVar3 + 0x40),
                       "Couldn\'t find float texture named \"%s\" for parameter \"%s\"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pcVar3 + 0x80),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (pcVar3 + 0x20));
          }
          pPVar7 = *(ParameterDictionary **)(cVar5._M_node + 2);
          goto LAB_00389378;
        }
        iVar4 = std::__cxx11::string::compare(pcVar3);
        if (iVar4 == 0) {
          RVar10 = ParameterDictionary::lookupSingle<(pbrt::ParameterType)1>
                             ((ParameterDictionary *)(name->_M_dataplus)._M_p,
                              (string *)alloc.memoryResource,0.0);
          pRVar6 = (ReturnType *)(**(code **)(*in_RCX + 0x10))(in_RCX,4,4);
          pPVar7 = (ParameterDictionary *)((ulong)pRVar6 | 0x5000000000000);
          *pRVar6 = RVar10;
          goto LAB_00389378;
        }
      }
      lVar9 = lVar9 + 8;
    } while (lVar2 << 3 != lVar9);
  }
  pPVar7 = (ParameterDictionary *)0x0;
LAB_00389378:
  this->dict = pPVar7;
  return (FloatTextureHandle)
         (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          )this;
}

Assistant:

FloatTextureHandle TextureParameterDictionary::GetFloatTextureOrNull(
    const std::string &name, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = textures->floatTextures.find(p->strings[0]);
            if (iter != textures->floatTextures.end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find float texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "float") {
            Float v = GetOneFloat(name, 0.f);  // we know this will be found
            return alloc.new_object<FloatConstantTexture>(v);
        }
    }

    return nullptr;
}